

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::AssignmentExpression::fromComponents
          (AssignmentExpression *this,Compilation *compilation,
          optional<slang::ast::BinaryOperator> op,bitmask<slang::ast::AssignFlags> flags,
          Expression *lhs,Expression *rhs,SourceLocation assignLoc,TimingControl *timingControl,
          SourceRange sourceRange,ASTContext *context)

{
  not_null<const_slang::ast::Type_*> *this_00;
  bool bVar1;
  Type *pTVar2;
  AssignmentExpression *expr;
  Expression *pEVar3;
  StreamingConcatenationExpression *lhs_00;
  BinaryExpression *this_01;
  Expression *pEVar4;
  Symbol *pSVar5;
  undefined4 in_register_0000000c;
  DiagCode code;
  SourceRange SVar6;
  SourceLocation SVar7;
  bool local_5d;
  bitmask<slang::ast::AssignFlags> flags_local;
  optional<slang::ast::BinaryOperator> op_local;
  
  pEVar3 = (Expression *)CONCAT44(in_register_0000000c,flags.m_bits);
  local_5d = (bool)(op.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ast::BinaryOperator>._M_payload._0_1_ & 1);
  this_00 = &pEVar3->type;
  flags_local.m_bits =
       op.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
       super__Optional_payload_base<slang::ast::BinaryOperator>._M_payload;
  op_local.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::BinaryOperator> =
       (_Optional_base<slang::ast::BinaryOperator,_true,_true>)
       (_Optional_base<slang::ast::BinaryOperator,_true,_true>)compilation;
  pTVar2 = not_null<const_slang::ast::Type_*>::get(this_00);
  expr = BumpAllocator::
         emplace<slang::ast::AssignmentExpression,std::optional<slang::ast::BinaryOperator>&,bool,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::TimingControl_const*&,slang::SourceRange&>
                   ((BumpAllocator *)this,&op_local,&local_5d,pTVar2,pEVar3,lhs,
                    (TimingControl **)&assignLoc,(SourceRange *)&timingControl);
  bVar1 = Expression::bad(pEVar3);
  if ((!bVar1) && (bVar1 = Expression::bad(lhs), SVar7 = sourceRange.endLoc, !bVar1)) {
    if (pEVar3->kind == Streaming) {
      lhs_00 = Expression::as<slang::ast::StreamingConcatenationExpression>(pEVar3);
      bVar1 = Bitstream::canBeTarget(lhs_00,lhs,(SourceLocation)rhs,(ASTContext *)SVar7);
      if ((bVar1) &&
         (bVar1 = Expression::requireLValue
                            (pEVar3,(ASTContext *)SVar7,(SourceLocation)rhs,
                             (bitmask<slang::ast::AssignFlags>)
                             op.super__Optional_base<slang::ast::BinaryOperator,_true,_true>.
                             _M_payload.super__Optional_payload_base<slang::ast::BinaryOperator>.
                             _M_payload,(Expression *)0x0,(EvalContext *)0x0), bVar1)) {
        return &expr->super_Expression;
      }
    }
    else {
      if (op_local.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ast::BinaryOperator>._M_engaged == true) {
        pTVar2 = not_null<const_slang::ast::Type_*>::get(this_00);
        SVar7 = (SourceLocation)0x307889;
        this_01 = (BinaryExpression *)
                  BumpAllocator::
                  emplace<slang::ast::LValueReferenceExpression,slang::ast::Type_const&,slang::SourceRange&>
                            ((BumpAllocator *)this,pTVar2,&pEVar3->sourceRange);
        SVar6.endLoc = SVar7;
        SVar6.startLoc = sourceRange.endLoc;
        pEVar4 = BinaryExpression::fromComponents
                           (this_01,expr->right_,
                            (Expression *)
                            ((ulong)op_local.
                                    super__Optional_base<slang::ast::BinaryOperator,_true,_true>.
                                    _M_payload.
                                    super__Optional_payload_base<slang::ast::BinaryOperator> &
                            0xffffffff),(BinaryOperator)rhs,(SourceLocation)timingControl,SVar6,
                            (ASTContext *)sourceRange.startLoc);
        expr->right_ = pEVar4;
      }
      pTVar2 = not_null<const_slang::ast::Type_*>::get(this_00);
      SVar7 = sourceRange.endLoc;
      pEVar4 = Expression::convertAssignment
                         ((ASTContext *)sourceRange.endLoc,pTVar2,expr->right_,(SourceLocation)rhs,
                          &expr->left_,&flags_local);
      expr->right_ = pEVar4;
      bVar1 = Expression::bad(pEVar4);
      if ((!bVar1) &&
         (bVar1 = Expression::requireLValue
                            (expr->left_,(ASTContext *)SVar7,(SourceLocation)rhs,flags_local,
                             (Expression *)0x0,(EvalContext *)0x0), bVar1)) {
        if (assignLoc == (SourceLocation)0x0) {
          return &expr->super_Expression;
        }
        pSVar5 = Expression::getSymbolReference(pEVar3,true);
        if ((pSVar5 == (Symbol *)0x0) || (pSVar5->kind != ClockVar)) {
          if (*(int *)assignLoc != 8) {
            return &expr->super_Expression;
          }
          if (*(SyntaxNode **)((long)assignLoc + 8) == (SyntaxNode *)0x0) {
            assert::assertFailed
                      ("timingControl->syntax",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                       ,0x207,
                       "static Expression &slang::ast::AssignmentExpression::fromComponents(Compilation &, std::optional<BinaryOperator>, bitmask<AssignFlags>, Expression &, Expression &, SourceLocation, const TimingControl *, SourceRange, const ASTContext &)"
                      );
          }
          SVar6 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)((long)assignLoc + 8));
          code.subsystem = Expressions;
          code.code = 0x40;
        }
        else {
          if (*(int *)assignLoc == 8) {
            return &expr->super_Expression;
          }
          if (*(SyntaxNode **)((long)assignLoc + 8) == (SyntaxNode *)0x0) {
            assert::assertFailed
                      ("timingControl->syntax",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                       ,0x202,
                       "static Expression &slang::ast::AssignmentExpression::fromComponents(Compilation &, std::optional<BinaryOperator>, bitmask<AssignFlags>, Expression &, Expression &, SourceLocation, const TimingControl *, SourceRange, const ASTContext &)"
                      );
          }
          SVar6 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)((long)assignLoc + 8));
          code.subsystem = Expressions;
          code.code = 0x37;
        }
        ASTContext::addDiag((ASTContext *)SVar7,code,SVar6);
        return &expr->super_Expression;
      }
    }
  }
  pEVar3 = Expression::badExpr((Compilation *)this,&expr->super_Expression);
  return pEVar3;
}

Assistant:

Expression& AssignmentExpression::fromComponents(
    Compilation& compilation, std::optional<BinaryOperator> op, bitmask<AssignFlags> flags,
    Expression& lhs, Expression& rhs, SourceLocation assignLoc, const TimingControl* timingControl,
    SourceRange sourceRange, const ASTContext& context) {

    auto result = compilation.emplace<AssignmentExpression>(op, flags.has(AssignFlags::NonBlocking),
                                                            *lhs.type, lhs, rhs, timingControl,
                                                            sourceRange);

    if (lhs.bad() || rhs.bad())
        return badExpr(compilation, result);

    if (lhs.kind == ExpressionKind::Streaming) {
        if (!Bitstream::canBeTarget(lhs.as<StreamingConcatenationExpression>(), rhs, assignLoc,
                                    context)) {
            return badExpr(compilation, result);
        }

        if (!lhs.requireLValue(context, assignLoc, flags))
            return badExpr(compilation, result);

        return *result;
    }

    // If this is a compound assignment operator create a binary expression that will
    // apply the operator for us on the right hand side.
    if (op) {
        auto lvalRef = compilation.emplace<LValueReferenceExpression>(*lhs.type, lhs.sourceRange);
        result->right_ = &BinaryExpression::fromComponents(*lvalRef, *result->right_, *op,
                                                           assignLoc, sourceRange, context);
    }

    result->right_ = &convertAssignment(context, *lhs.type, *result->right_, assignLoc,
                                        &result->left_, &flags);
    if (result->right_->bad())
        return badExpr(compilation, result);

    if (!result->left_->requireLValue(context, assignLoc, flags))
        return badExpr(compilation, result);

    if (timingControl) {
        // Cycle delays are only allowed on clock vars, and clock vars
        // cannot use any timing control other than cycle delays.
        if (auto sym = lhs.getSymbolReference(); sym && sym->kind == SymbolKind::ClockVar) {
            if (timingControl->kind != TimingControlKind::CycleDelay) {
                ASSERT(timingControl->syntax);
                context.addDiag(diag::ClockVarBadTiming, timingControl->syntax->sourceRange());
            }
        }
        else if (timingControl->kind == TimingControlKind::CycleDelay) {
            ASSERT(timingControl->syntax);
            context.addDiag(diag::CycleDelayNonClock, timingControl->syntax->sourceRange());
        }
    }

    return *result;
}